

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolsb.c
# Opt level: O2

int ffs1fi1(char *input,long ntodo,double scale,double zero,uchar *output,int *status)

{
  long lVar1;
  long lVar2;
  uchar uVar3;
  double dVar4;
  
  if ((((scale != 1.0) || (NAN(scale))) || (zero != -128.0)) || (NAN(zero))) {
    lVar1 = 0;
    if (0 < ntodo) {
      lVar1 = ntodo;
    }
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
        dVar4 = ((double)(int)input[lVar2] - zero) / scale;
        if (-0.49 <= dVar4) {
          if (dVar4 <= 255.49) {
            uVar3 = (uchar)(int)(dVar4 + 0.5);
          }
          else {
            *status = -0xb;
            uVar3 = 0xff;
          }
        }
        else {
          *status = -0xb;
          uVar3 = '\0';
        }
        output[lVar2] = uVar3;
      }
    }
    else {
      for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
        uVar3 = input[lVar2];
        if ((char)uVar3 < '\0') {
          *status = -0xb;
          uVar3 = '\0';
        }
        output[lVar2] = uVar3;
      }
    }
  }
  else {
    lVar1 = 0;
    if (ntodo < 1) {
      ntodo = lVar1;
    }
    for (; ntodo != lVar1; lVar1 = lVar1 + 1) {
      output[lVar1] = input[lVar1] + 0x80;
    }
  }
  return *status;
}

Assistant:

int ffs1fi1(signed char *input,    /* I - array of values to be converted  */
            long ntodo,            /* I - number of elements in the array  */
            double scale,          /* I - FITS TSCALn or BSCALE value      */
            double zero,           /* I - FITS TZEROn or BZERO  value      */
            unsigned char *output, /* O - output array of converted values */
            int *status)           /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == -128.)
    {
        /* Instead of adding 128, it is more efficient */
        /* to just flip the sign bit with the XOR operator */

        for (ii = 0; ii < ntodo; ii++)
             output[ii] =  ( *(unsigned char *) &input[ii] ) ^ 0x80;
    }
    else if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
        {
            if (input[ii] < 0)
            {
                *status = OVERFLOW_ERR;
                output[ii] = 0;
            }
            else
                output[ii] = (unsigned char) input[ii];
        }
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = ( ((double) input[ii]) - zero) / scale;

            if (dvalue < DUCHAR_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = 0;
            }
            else if (dvalue > DUCHAR_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = UCHAR_MAX;
            }
            else
                output[ii] = (unsigned char) (dvalue + .5);
        }
    }
    return(*status);
}